

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ctr_drbg.c
# Opt level: O3

int mbedtls_ctr_drbg_random_with_add
              (void *p_rng,uchar *output,size_t output_len,uchar *additional,size_t add_len)

{
  char *pcVar1;
  int iVar2;
  long lVar3;
  size_t __n;
  uchar local_78 [8];
  uchar tmp [16];
  uchar add_input [48];
  
  if (0x400 < output_len) {
    return -0x36;
  }
  if (0x100 < add_len) {
    return -0x38;
  }
  tmp[8] = '\0';
  tmp[9] = '\0';
  tmp[10] = '\0';
  tmp[0xb] = '\0';
  tmp[0xc] = '\0';
  tmp[0xd] = '\0';
  tmp[0xe] = '\0';
  tmp[0xf] = '\0';
  if ((*(int *)((long)p_rng + 0x20) < *(int *)((long)p_rng + 0x10)) ||
     (*(int *)((long)p_rng + 0x14) != 0)) {
    iVar2 = mbedtls_ctr_drbg_reseed_internal((mbedtls_ctr_drbg_context *)p_rng,additional,add_len,0)
    ;
    if (iVar2 != 0) {
      return iVar2;
    }
  }
  else if ((add_len != 0) &&
          ((iVar2 = block_cipher_df(tmp + 8,additional,add_len), iVar2 != 0 ||
           (iVar2 = ctr_drbg_update_internal((mbedtls_ctr_drbg_context *)p_rng,tmp + 8), iVar2 != 0)
           ))) goto LAB_001b7238;
  if (output_len != 0) {
    do {
      lVar3 = 0xf;
      do {
        if (lVar3 == -1) break;
        pcVar1 = (char *)((long)p_rng + lVar3);
        *pcVar1 = *pcVar1 + '\x01';
        lVar3 = lVar3 + -1;
      } while (*pcVar1 == '\0');
      iVar2 = mbedtls_aes_crypt_ecb
                        ((mbedtls_aes_context *)((long)p_rng + 0x28),1,(uchar *)p_rng,local_78);
      if (iVar2 != 0) goto LAB_001b7238;
      __n = 0x10;
      if (output_len < 0x10) {
        __n = output_len;
      }
      memcpy(output,local_78,__n);
      output = output + __n;
      output_len = output_len - __n;
    } while (output_len != 0);
  }
  iVar2 = ctr_drbg_update_internal((mbedtls_ctr_drbg_context *)p_rng,tmp + 8);
  if (iVar2 == 0) {
    *(int *)((long)p_rng + 0x10) = *(int *)((long)p_rng + 0x10) + 1;
    iVar2 = 0;
  }
LAB_001b7238:
  mbedtls_platform_zeroize(tmp + 8,0x30);
  mbedtls_platform_zeroize(local_78,0x10);
  return iVar2;
}

Assistant:

int mbedtls_ctr_drbg_random_with_add(void *p_rng,
                                     unsigned char *output, size_t output_len,
                                     const unsigned char *additional, size_t add_len)
{
    int ret = 0;
    mbedtls_ctr_drbg_context *ctx = (mbedtls_ctr_drbg_context *) p_rng;
    unsigned char add_input[MBEDTLS_CTR_DRBG_SEEDLEN];
    unsigned char *p = output;
    unsigned char tmp[MBEDTLS_CTR_DRBG_BLOCKSIZE];
    int i;
    size_t use_len;

    if (output_len > MBEDTLS_CTR_DRBG_MAX_REQUEST) {
        return MBEDTLS_ERR_CTR_DRBG_REQUEST_TOO_BIG;
    }

    if (add_len > MBEDTLS_CTR_DRBG_MAX_INPUT) {
        return MBEDTLS_ERR_CTR_DRBG_INPUT_TOO_BIG;
    }

    memset(add_input, 0, MBEDTLS_CTR_DRBG_SEEDLEN);

    if (ctx->reseed_counter > ctx->reseed_interval ||
        ctx->prediction_resistance) {
        if ((ret = mbedtls_ctr_drbg_reseed(ctx, additional, add_len)) != 0) {
            return ret;
        }
        add_len = 0;
    }

    if (add_len > 0) {
        if ((ret = block_cipher_df(add_input, additional, add_len)) != 0) {
            goto exit;
        }
        if ((ret = ctr_drbg_update_internal(ctx, add_input)) != 0) {
            goto exit;
        }
    }

    while (output_len > 0) {
        /*
         * Increase counter
         */
        for (i = MBEDTLS_CTR_DRBG_BLOCKSIZE; i > 0; i--) {
            if (++ctx->counter[i - 1] != 0) {
                break;
            }
        }

        /*
         * Crypt counter block
         */
        if ((ret = mbedtls_aes_crypt_ecb(&ctx->aes_ctx, MBEDTLS_AES_ENCRYPT,
                                         ctx->counter, tmp)) != 0) {
            goto exit;
        }

        use_len = (output_len > MBEDTLS_CTR_DRBG_BLOCKSIZE)
            ? MBEDTLS_CTR_DRBG_BLOCKSIZE : output_len;
        /*
         * Copy random block to destination
         */
        memcpy(p, tmp, use_len);
        p += use_len;
        output_len -= use_len;
    }

    if ((ret = ctr_drbg_update_internal(ctx, add_input)) != 0) {
        goto exit;
    }

    ctx->reseed_counter++;

exit:
    mbedtls_platform_zeroize(add_input, sizeof(add_input));
    mbedtls_platform_zeroize(tmp, sizeof(tmp));
    return ret;
}